

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_align_quad_seq(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LIST next_list;
  REF_LIST previous_list;
  REF_CLOUD next_cloud;
  REF_CLOUD previous_cloud;
  REF_GRID pRStack_18;
  REF_INT layers;
  REF_GRID ref_grid_local;
  
  previous_cloud._4_4_ = 2;
  pRStack_18 = ref_grid;
  uVar1 = ref_cloud_create(&next_cloud,3);
  if (uVar1 == 0) {
    uVar1 = ref_list_create(&next_list);
    if (uVar1 == 0) {
      uVar1 = ref_layer_align_first_layer(pRStack_18,next_cloud,next_list);
      if (uVar1 == 0) {
        if (1 < previous_cloud._4_4_) {
          uVar1 = ref_layer_quad_right_triangles(pRStack_18);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2b5,"ref_layer_align_quad_seq",(ulong)uVar1,"tri2qaud");
            return uVar1;
          }
          uVar1 = ref_cloud_create((REF_CLOUD *)&previous_list,3);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2b6,"ref_layer_align_quad_seq",(ulong)uVar1,"next cloud");
            return uVar1;
          }
          uVar1 = ref_list_create((REF_LIST *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2b7,"ref_layer_align_quad_seq",(ulong)uVar1,"next list");
            return uVar1;
          }
          uVar1 = ref_layer_align_quad_advance
                            (pRStack_18,next_cloud,next_list,(REF_CLOUD)previous_list,
                             _ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2ba,"ref_layer_align_quad_seq",(ulong)uVar1,"first layer");
            return uVar1;
          }
          uVar1 = ref_cloud_free(next_cloud);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,699,"ref_layer_align_quad_seq",(ulong)uVar1,"free previous cloud");
            return uVar1;
          }
          uVar1 = ref_list_free(next_list);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,700,"ref_layer_align_quad_seq",(ulong)uVar1,"free previous list");
            return uVar1;
          }
          next_cloud = (REF_CLOUD)previous_list;
          next_list = _ref_private_macro_code_rss_1;
          previous_list = (REF_LIST)0x0;
          _ref_private_macro_code_rss_1 = (REF_LIST)0x0;
        }
        uVar1 = ref_cloud_free(next_cloud);
        if (uVar1 == 0) {
          ref_grid_local._4_4_ = ref_layer_quad_right_triangles(pRStack_18);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x2c5,"ref_layer_align_quad_seq",(ulong)ref_grid_local._4_4_,"tri2qaud");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x2c3,"ref_layer_align_quad_seq",(ulong)uVar1,"free next cloud");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x2b3,"ref_layer_align_quad_seq",(ulong)uVar1,"first layer");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2b0
             ,"ref_layer_align_quad_seq",(ulong)uVar1,"previous list");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2af,
           "ref_layer_align_quad_seq",(ulong)uVar1,"previous cloud");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_align_quad_seq(REF_GRID ref_grid) {
  REF_INT layers = 2;
  REF_CLOUD previous_cloud, next_cloud;
  REF_LIST previous_list, next_list;
  RSS(ref_cloud_create(&previous_cloud, 3), "previous cloud");
  RSS(ref_list_create(&previous_list), "previous list");

  RSS(ref_layer_align_first_layer(ref_grid, previous_cloud, previous_list),
      "first layer");
  if (layers > 1) {
    RSS(ref_layer_quad_right_triangles(ref_grid), "tri2qaud");
    RSS(ref_cloud_create(&next_cloud, 3), "next cloud");
    RSS(ref_list_create(&next_list), "next list");
    RSS(ref_layer_align_quad_advance(ref_grid, previous_cloud, previous_list,
                                     next_cloud, next_list),
        "first layer");
    RSS(ref_cloud_free(previous_cloud), "free previous cloud");
    RSS(ref_list_free(previous_list), "free previous list");
    previous_cloud = next_cloud;
    previous_list = next_list;
    next_cloud = NULL;
    next_list = NULL;
  }

  RSS(ref_cloud_free(previous_cloud), "free next cloud");

  RSS(ref_layer_quad_right_triangles(ref_grid), "tri2qaud");

  return REF_SUCCESS;
}